

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

EmptyStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EmptyStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  EmptyStatementSyntax *this_00;
  
  this_00 = (EmptyStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((EmptyStatementSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (EmptyStatementSyntax *)allocateSlow(this,0x68,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  TVar2 = args_2->kind;
  uVar3 = args_2->field_0x2;
  NVar4.raw = (args_2->numFlags).raw;
  uVar5 = args_2->rawLen;
  pIVar1 = args_2->info;
  slang::syntax::StatementSyntax::StatementSyntax
            (&this_00->super_StatementSyntax,EmptyStatement,*args,args_1);
  (this_00->semicolon).kind = TVar2;
  (this_00->semicolon).field_0x2 = uVar3;
  (this_00->semicolon).numFlags = (NumericTokenFlags)NVar4.raw;
  (this_00->semicolon).rawLen = uVar5;
  (this_00->semicolon).info = pIVar1;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }